

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O1

xml_node __thiscall
NULLCPugiXML::xml_node__insert_child_before1
          (NULLCPugiXML *this,NULLCArray name,xml_node *node,xml_node *ptr)

{
  xml_node ret;
  xml_node local_28;
  
  if (this == (NULLCPugiXML *)0x0) {
    nullcThrowError("name is empty",name.ptr);
    local_28._root = (xml_node_struct *)0x0;
    pugi::xml_node::xml_node(&local_28);
  }
  else {
    pugi::xml_node::xml_node(&local_28);
    local_28 = pugi::xml_node::insert_child_before
                         (&node->node,(char_t *)this,
                          (xml_node *)CONCAT44((int)((ulong)register0x00000010 >> 0x20),name.len));
  }
  return (xml_node)(xml_node)local_28._root;
}

Assistant:

xml_node xml_node__insert_child_before1(NULLCArray name, xml_node* node, xml_node* ptr)
	{
		if(!name.ptr)
		{
			nullcThrowError("name is empty");
			return xml_node();
		}
		xml_node ret;
		ret.node = ptr->node.insert_child_before(name.ptr, node->node);
		return ret;
	}